

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::clear
          (IntervalMap<unsigned_long,_std::monostate,_0U> *this,allocator_type *alloc)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  PoolAllocator<char,_192UL,_64UL> *this_00;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *in_RSI;
  IntervalMap<unsigned_long,_std::monostate,_0U> *in_RDI;
  size_t e_1;
  size_t i_2;
  size_t s;
  size_t j;
  size_t e;
  size_t i_1;
  uint32_t h;
  uint32_t i;
  SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> nextRefs;
  SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> refs;
  BranchNode<unsigned_long,_8U,_false> *in_stack_fffffffffffffed8;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *elem;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> *in_stack_fffffffffffffee0;
  size_type local_d0;
  ulong local_c0;
  size_type local_b0;
  uint32_t local_a8;
  uint local_94;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> *in_stack_ffffffffffffff88;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> *in_stack_ffffffffffffff90;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> local_50 [2];
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *local_10;
  
  local_10 = in_RSI;
  bVar1 = isFlat(in_RDI);
  if (!bVar1) {
    SmallVector<slang::IntervalMapDetails::NodeRef,_5UL>::SmallVector
              ((SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> *)0xa544be);
    SmallVector<slang::IntervalMapDetails::NodeRef,_5UL>::SmallVector
              ((SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> *)0xa544cb);
    for (local_94 = 0; local_94 < in_RDI->rootSize; local_94 = local_94 + 1) {
      IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>::childAt
                ((BranchNode<unsigned_long,_8U,_true> *)in_RDI,local_94);
      SmallVectorBase<slang::IntervalMapDetails::NodeRef>::push_back
                (in_stack_fffffffffffffee0,(NodeRef *)in_stack_fffffffffffffed8);
    }
    local_a8 = in_RDI->height;
    while (local_a8 = local_a8 - 1, local_a8 != 0) {
      local_b0 = 0;
      sVar3 = SmallVectorBase<slang::IntervalMapDetails::NodeRef>::size(local_50);
      for (; local_b0 != sVar3; local_b0 = local_b0 + 1) {
        local_c0 = 0;
        SmallVectorBase<slang::IntervalMapDetails::NodeRef>::operator[](local_50,local_b0);
        uVar2 = IntervalMapDetails::NodeRef::size((NodeRef *)0xa545cf);
        for (; local_c0 != uVar2; local_c0 = local_c0 + 1) {
          SmallVectorBase<slang::IntervalMapDetails::NodeRef>::operator[](local_50,local_b0);
          IntervalMapDetails::NodeRef::childAt
                    ((NodeRef *)in_stack_fffffffffffffee0,
                     (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
          SmallVectorBase<slang::IntervalMapDetails::NodeRef>::push_back
                    (in_stack_fffffffffffffee0,(NodeRef *)in_stack_fffffffffffffed8);
        }
        SmallVectorBase<slang::IntervalMapDetails::NodeRef>::operator[](local_50,local_b0);
        IntervalMapDetails::NodeRef::
        get<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                  ((NodeRef *)in_stack_fffffffffffffee0);
        PoolAllocator<char,192ul,64ul>::
        destroy<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                  ((PoolAllocator<char,_192UL,_64UL> *)in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8);
      }
      SmallVectorBase<slang::IntervalMapDetails::NodeRef>::clear(in_stack_fffffffffffffee0);
      SmallVectorBase<slang::IntervalMapDetails::NodeRef>::swap
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    local_d0 = 0;
    sVar3 = SmallVectorBase<slang::IntervalMapDetails::NodeRef>::size(local_50);
    for (; local_d0 != sVar3; local_d0 = local_d0 + 1) {
      elem = local_10;
      this_00 = (PoolAllocator<char,_192UL,_64UL> *)
                SmallVectorBase<slang::IntervalMapDetails::NodeRef>::operator[](local_50,local_d0);
      IntervalMapDetails::NodeRef::
      get<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                ((NodeRef *)this_00);
      PoolAllocator<char,192ul,64ul>::
      destroy<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                (this_00,elem);
    }
    switchToLeaf((IntervalMap<unsigned_long,_std::monostate,_0U> *)0xa5474e);
    SmallVector<slang::IntervalMapDetails::NodeRef,_5UL>::~SmallVector
              ((SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> *)0xa5475b);
    SmallVector<slang::IntervalMapDetails::NodeRef,_5UL>::~SmallVector
              ((SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> *)0xa54768);
  }
  in_RDI->rootSize = 0;
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::clear(allocator_type& alloc) {
    using namespace IntervalMapDetails;
    if (!isFlat()) {
        // Collect level 0 nodes from the root.
        SmallVector<NodeRef> refs, nextRefs;
        for (uint32_t i = 0; i < rootSize; i++)
            refs.push_back(rootBranch.childAt(i));

        // Visit all branch nodes.
        for (uint32_t h = height - 1; h > 0; h--) {
            for (size_t i = 0, e = refs.size(); i != e; i++) {
                for (size_t j = 0, s = refs[i].size(); j != s; j++)
                    nextRefs.push_back(refs[i].childAt(uint32_t(j)));

                alloc.destroy(&refs[i].get<Branch>());
            }

            refs.clear();
            refs.swap(nextRefs);
        }

        // Visit all leaf nodes.
        for (size_t i = 0, e = refs.size(); i != e; i++)
            alloc.destroy(&refs[i].get<Leaf>());

        switchToLeaf();
    }
    rootSize = 0;
}